

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetLocation(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  undefined8 *puVar3;
  optional<float> oVar4;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Ptr PVar6;
  path_type local_58;
  
  *(undefined8 *)this = 0;
  puVar3 = (undefined8 *)operator_new(0x18);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_002aa560;
  puVar3[2] = 0;
  *(undefined8 **)(this + 8) = puVar3;
  *(undefined8 **)this = puVar3 + 2;
  paVar1 = &local_58.m_value.field_2;
  local_58.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"longitude","");
  local_58.m_separator = '.';
  local_58.m_start._M_current = local_58.m_value._M_dataplus._M_p;
  oVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<float>(in_RDX,&local_58);
  if (((ulong)oVar4.super_type & 1) == 0) {
    fVar2 = 0.0;
  }
  else {
    fVar2 = oVar4.super_type.m_storage;
  }
  *(float *)(puVar3 + 2) = fVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.m_value._M_dataplus._M_p);
  }
  local_58.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"latitude","");
  local_58.m_separator = '.';
  local_58.m_start._M_current = local_58.m_value._M_dataplus._M_p;
  oVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<float>(in_RDX,&local_58);
  if (((ulong)oVar4.super_type & 1) == 0) {
    fVar2 = 0.0;
  }
  else {
    fVar2 = oVar4.super_type.m_storage;
  }
  *(float *)((long)puVar3 + 0x14) = fVar2;
  _Var5._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.m_value._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX_00;
  }
  PVar6.super___shared_ptr<TgBot::Location,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  PVar6.super___shared_ptr<TgBot::Location,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar6.super___shared_ptr<TgBot::Location,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Location::Ptr TgTypeParser::parseJsonAndGetLocation(const ptree& data) const {
    auto result(make_shared<Location>());
    result->longitude = data.get<float>("longitude", 0);
    result->latitude = data.get<float>("latitude", 0);
    return result;
}